

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

int nondefp(sexp x)

{
  sexp_tag_t sVar1;
  int iVar2;
  int iVar3;
  sexp psVar4;
  
  iVar2 = 0;
  iVar3 = 0;
  if (((ulong)x & 3) == 0) {
    sVar1 = x->tag;
    if ((sVar1 == 6) || (sVar1 == 0x1d)) {
LAB_0012cd59:
      iVar3 = 1;
    }
    else {
      iVar3 = iVar2;
      if (sVar1 == 0x21) {
        for (psVar4 = (x->value).type.name; (((ulong)psVar4 & 3) == 0 && (psVar4->tag == 6));
            psVar4 = (psVar4->value).type.cpl) {
          iVar2 = nondefp((psVar4->value).type.name);
          if (iVar2 != 0) goto LAB_0012cd59;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int nondefp(sexp x) {
  sexp ls;
  if (sexp_pairp(x) || sexp_cndp(x))
    return 1;
  if (sexp_seqp(x))
    for (ls=sexp_seq_ls(x); sexp_pairp(ls); ls=sexp_cdr(ls))
      if (nondefp(sexp_car(ls)))
        return 1;
  return 0;
}